

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

void __thiscall deqp::gles31::Functional::UniformCase::deinit(UniformCase *this)

{
  TextureCube *this_00;
  pointer puVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  pointer ppTVar5;
  long lVar6;
  
  ppTVar2 = (this->m_textures2d).
            super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar4 = (this->m_textures2d).
            super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppTVar4 - (long)ppTVar2) >> 3)) {
    lVar6 = 0;
    do {
      if (ppTVar2[lVar6] != (Texture2D *)0x0) {
        (*ppTVar2[lVar6]->_vptr_Texture2D[1])();
      }
      lVar6 = lVar6 + 1;
      ppTVar2 = (this->m_textures2d).
                super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppTVar4 = (this->m_textures2d).
                super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (lVar6 < (int)((ulong)((long)ppTVar4 - (long)ppTVar2) >> 3));
  }
  if (ppTVar4 != ppTVar2) {
    (this->m_textures2d).super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar2;
  }
  ppTVar3 = (this->m_texturesCube).
            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar5 = (this->m_texturesCube).
            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppTVar5 - (long)ppTVar3) >> 3)) {
    lVar6 = 0;
    do {
      this_00 = ppTVar3[lVar6];
      if (this_00 != (TextureCube *)0x0) {
        glu::TextureCube::~TextureCube(this_00);
        operator_delete(this_00,0x180);
      }
      lVar6 = lVar6 + 1;
      ppTVar3 = (this->m_texturesCube).
                super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppTVar5 = (this->m_texturesCube).
                super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (lVar6 < (int)((ulong)((long)ppTVar5 - (long)ppTVar3) >> 3));
  }
  if (ppTVar5 != ppTVar3) {
    (this->m_texturesCube).
    super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar3;
  }
  puVar1 = (this->m_filledTextureUnits).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->m_filledTextureUnits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void UniformCase::deinit (void)
{
	for (int i = 0; i < (int)m_textures2d.size(); i++)
		delete m_textures2d[i];
	m_textures2d.clear();

	for (int i = 0; i < (int)m_texturesCube.size(); i++)
		delete m_texturesCube[i];
	m_texturesCube.clear();

	m_filledTextureUnits.clear();
}